

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>
          (enum_<asd::AD_range> *this,handle *scope,char *name,arithmetic *extra)

{
  str_attr_accessor local_b0;
  arg local_90;
  is_method local_80;
  name local_78;
  is_new_style_constructor local_6a;
  type local_69;
  cpp_function local_68;
  type local_5b;
  type local_5a;
  anon_class_1_0_00000001 local_59;
  arg local_58;
  anon_class_1_0_00000001 local_40;
  factory<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ToruNiina[P]libasd_extlib_pybind11_include_pybind11_pybind11_h:2155:18),_pybind11::detail::void_type_(*)(),_asd::AD_range_(unsigned_int),_pybind11::detail::void_type_()>
  local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  bool is_convertible;
  bool is_arithmetic;
  PyObject *local_30;
  arithmetic *local_28;
  arithmetic *extra_local;
  char *name_local;
  handle *scope_local;
  enum_<asd::AD_range> *this_local;
  
  local_30 = scope->m_ptr;
  local_28 = extra;
  extra_local = (arithmetic *)name;
  name_local = (char *)scope;
  scope_local = (handle *)this;
  class_<asd::AD_range>::class_<pybind11::arithmetic>
            (&this->super_class_<asd::AD_range>,(handle)local_30,name,extra);
  detail::enum_base::enum_base(&this->m_base,(handle *)this,(handle *)name_local);
  local_3d = 1;
  local_3e = 0;
  detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x1);
  init<pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(unsigned_int)_1_,pybind11::detail::initimpl::factory<pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),asd::AD_range(unsigned_int),pybind11::detail::void_type()>>
            (&local_40);
  pybind11::arg::arg(&local_58,"value");
  class_<asd::AD_range>::
  def<pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),asd::AD_range(unsigned_int),pybind11::detail::void_type(),pybind11::arg>
            (&this->super_class_<asd::AD_range>,&local_3f,&local_58);
  class_<asd::AD_range>::
  def_property_readonly<pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(asd::AD_range)_1_>
            (&this->super_class_<asd::AD_range>,"value",&local_59);
  class_<asd::AD_range>::
  def<pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(asd::AD_range)_2_>
            (&this->super_class_<asd::AD_range>,"__int__",&local_5a);
  class_<asd::AD_range>::
  def<pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(asd::AD_range)_3_>
            (&this->super_class_<asd::AD_range>,"__index__",&local_5b);
  pybind11::name::name(&local_78,"__setstate__");
  is_method::is_method(&local_80,(handle *)this);
  pybind11::arg::arg(&local_90,"state");
  cpp_function::
  cpp_function<pybind11::enum_<asd::AD_range>::enum_<pybind11::arithmetic>(pybind11::handle_const&,char_const*,pybind11::arithmetic_const&)::_lambda(pybind11::detail::value_and_holder&,unsigned_int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            (&local_68,&local_69,&local_6a,&local_78,&local_80,&local_90);
  detail::object_api<pybind11::handle>::attr
            (&local_b0,(object_api<pybind11::handle> *)this,"__setstate__");
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=(&local_b0,&local_68);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_b0);
  cpp_function::~cpp_function(&local_68);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra &...extra)
        : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Underlying>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def_property_readonly("value", [](Type value) { return (Scalar) value; });
        def("__int__", [](Type value) { return (Scalar) value; });
        def("__index__", [](Type value) { return (Scalar) value; });
        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(
                    v_h, static_cast<Type>(arg), Py_TYPE(v_h.inst) != v_h.type->type);
            },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"),
            is_method(*this),
            arg("state"));
    }